

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilities.cpp
# Opt level: O3

XmlNodePtr __thiscall libcellml::mathmlChildNode(libcellml *this,XmlNodePtr *node,size_t index)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  bool bVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  XmlNode this_01;
  size_t sVar4;
  XmlNodePtr XVar5;
  XmlNode local_38;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_30;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  
  XmlNode::firstChild((XmlNode *)this);
  bVar2 = XmlNode::isMathmlElement(*(XmlNode **)this,(char *)0x0);
  sVar4 = (ulong)bVar2 - 1;
  _Var3._M_pi = extraout_RDX;
  if (sVar4 != index && *(long *)this != 0) {
    do {
      XVar5 = XmlNode::next(&local_38);
      p_Var1 = p_Stack_30;
      this_01.mPimpl = local_38.mPimpl;
      _Var3 = XVar5.super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi;
      local_38.mPimpl = (XmlNodeImpl *)0x0;
      p_Stack_30 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      *(XmlNodeImpl **)this = this_01.mPimpl;
      this_00 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(this + 8);
      *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(this + 8) = p_Var1;
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
        _Var3._M_pi = extraout_RDX_00;
        if (p_Stack_30 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_30);
          _Var3._M_pi = extraout_RDX_01;
        }
        this_01.mPimpl = *(XmlNodeImpl **)this;
      }
    } while ((((XmlNode *)this_01.mPimpl != (XmlNode *)0x0) &&
             (bVar2 = XmlNode::isMathmlElement((XmlNode *)this_01.mPimpl,(char *)0x0),
             _Var3._M_pi = extraout_RDX_02, *(long *)this != 0)) &&
            (sVar4 = sVar4 + bVar2, sVar4 != index));
  }
  XVar5.super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var3._M_pi;
  XVar5.super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (XmlNodePtr)XVar5.super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

XmlNodePtr mathmlChildNode(const XmlNodePtr &node, size_t index)
{
    auto res = node->firstChild();
    auto childNodeIndex = res->isMathmlElement() ? 0 : MAX_SIZE_T;

    while ((res != nullptr) && (childNodeIndex != index)) {
        res = res->next();

        if ((res != nullptr) && res->isMathmlElement()) {
            ++childNodeIndex;
        }
    }

    return res;
}